

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint fmt::v5::internal::
     parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>>&>
               (wchar_t **begin,wchar_t *end,
               specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>
               *eh)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  uint uVar3;
  
  if (**begin == L'0') {
    *begin = *begin + 1;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    pwVar1 = *begin;
    while (pwVar2 = pwVar1 + 1, uVar3 < 0xccccccd) {
      uVar3 = (*pwVar1 + uVar3 * 10) - 0x30;
      *begin = pwVar2;
      if ((pwVar2 == end) || (pwVar1 = pwVar2, 9 < (uint)(*pwVar2 + L'\xffffffd0')))
      goto LAB_001bc4bf;
    }
    uVar3 = 0x80000000;
LAB_001bc4bf:
    if ((int)uVar3 < 0) {
      error_handler::on_error
                ((error_handler *)
                 (eh->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
                 ).context_,"number is too big");
    }
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}